

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c-writer.cc
# Opt level: O1

string * __thiscall
wabt::(anonymous_namespace)::SanitizeForComment_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,string_view str)

{
  long *plVar1;
  long *plVar2;
  _anonymous_namespace_ *p_Var3;
  long *local_70;
  long local_60;
  long lStack_58;
  string local_50;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  if (this != (_anonymous_namespace_ *)0x0) {
    p_Var3 = (_anonymous_namespace_ *)0x0;
    do {
      if ((byte)((char)p_Var3[str._M_len] + 0x81U) < 0xa1 ||
          ((byte)p_Var3[str._M_len] & 0xef) == 0x2f) {
        StringPrintf_abi_cxx11_(&local_50,"%02X");
        plVar2 = (long *)std::__cxx11::string::replace((ulong)&local_50,0,(char *)0x0,0x1f0a7c);
        plVar1 = plVar2 + 2;
        if ((long *)*plVar2 == plVar1) {
          local_60 = *plVar1;
          lStack_58 = plVar2[3];
          local_70 = &local_60;
        }
        else {
          local_60 = *plVar1;
          local_70 = (long *)*plVar2;
        }
        *plVar2 = (long)plVar1;
        plVar2[1] = 0;
        *(undefined1 *)(plVar2 + 2) = 0;
        std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_70);
        if (local_70 != &local_60) {
          operator_delete(local_70,local_60 + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        }
      }
      else {
        std::__cxx11::string::push_back((char)__return_storage_ptr__);
      }
      p_Var3 = p_Var3 + 1;
    } while (this != p_Var3);
  }
  return __return_storage_ptr__;
}

Assistant:

static std::string SanitizeForComment(std::string_view str) {
  std::string result;

  for (const uint8_t ch : str) {
    // escape control chars, DEL, >7-bit chars, trigraphs, and end of comment
    if (ch < ' ' || ch > '~' || ch == '?' || ch == '/') {
      result += "\\" + StringPrintf("%02X", ch);
    } else {
      result += ch;
    }
  }

  return result;
}